

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::yml::detail::ReferenceResolver::count_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  NodeType_e NVar1;
  NodeType_e NVar2;
  NodeType_e NVar3;
  NodeData *pNVar4;
  size_t n_00;
  size_t sVar5;
  size_t sVar6;
  
  pNVar4 = Tree::_p(this->t,n);
  NVar2 = (pNVar4->m_type).type;
  pNVar4 = Tree::_p(this->t,n);
  NVar1 = (pNVar4->m_type).type;
  pNVar4 = Tree::_p(this->t,n);
  NVar3 = (pNVar4->m_type).type;
  pNVar4 = Tree::_p(this->t,n);
  sVar6 = (ulong)((uint)(int)NVar3 >> 6 & 1) +
          (ulong)((NVar1 & (SEQ|MAP|VAL)) != NOTYPE & (byte)(NVar1 >> 9)) +
          (ulong)((~(int)NVar2 & 0x102U) == 0) +
          (ulong)(((uint)(int)(pNVar4->m_type).type >> 7 & 1) != 0);
  for (n_00 = Tree::first_child(this->t,n); n_00 != 0xffffffffffffffff;
      n_00 = Tree::next_sibling(this->t,n_00)) {
    sVar5 = count_anchors_and_refs(this,n_00);
    sVar6 = sVar6 + sVar5;
  }
  return sVar6;
}

Assistant:

size_t count_anchors_and_refs(size_t n)
    {
        size_t c = 0;
        c += t->has_key_anchor(n);
        c += t->has_val_anchor(n);
        c += t->is_key_ref(n);
        c += t->is_val_ref(n);
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
            c += count_anchors_and_refs(ch);
        return c;
    }